

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  TokenType TVar1;
  size_t __n;
  bool bVar2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  LogMessage *other;
  EnumValueDescriptor *value_00;
  char *pcVar6;
  undefined8 *puVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  FieldDescriptor *pFVar11;
  byte bVar12;
  _Alloc_hider _Var13;
  float value_01;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  EnumDescriptor *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string value_4;
  int64 int_value;
  int64 value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    int_value = (int64)FieldDescriptor::TypeOnceInit;
    local_90 = (undefined1  [8])field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&int_value,
               (FieldDescriptor **)local_90);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    bVar4 = ConsumeSignedInteger(this,&int_value,0x7fffffff);
    if (bVar4) {
      if (*(int *)(field + 0x3c) == 3) {
        Reflection::AddInt32(reflection,message,field,(uint32)int_value);
      }
      else {
        Reflection::SetInt32(reflection,message,field,(uint32)int_value);
      }
      break;
    }
    goto LAB_002fe9a9;
  case 2:
    bVar4 = ConsumeSignedInteger(this,&int_value,0x7fffffffffffffff);
    if (!bVar4) goto LAB_002fe9a9;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(reflection,message,field,int_value);
    }
    else {
      Reflection::SetInt64(reflection,message,field,int_value);
    }
    break;
  case 3:
    bVar4 = ConsumeUnsignedInteger(this,(uint64 *)&int_value,0xffffffff);
    if (!bVar4) goto LAB_002fe9a9;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(reflection,message,field,(uint32)int_value);
    }
    else {
      Reflection::SetUInt32(reflection,message,field,(uint32)int_value);
    }
    break;
  case 4:
    bVar4 = ConsumeUnsignedInteger(this,(uint64 *)&int_value,0xffffffffffffffff);
    if (!bVar4) goto LAB_002fe9a9;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(reflection,message,field,int_value);
    }
    else {
      Reflection::SetUInt64(reflection,message,field,int_value);
    }
    break;
  case 5:
    bVar4 = ConsumeDouble(this,(double *)&int_value);
    if (!bVar4) goto LAB_002fe9a9;
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(reflection,message,field,(double)int_value);
    }
    else {
      Reflection::SetDouble(reflection,message,field,(double)int_value);
    }
    break;
  case 6:
    bVar4 = ConsumeDouble(this,(double *)&int_value);
    if (!bVar4) goto LAB_002fe9a9;
    iVar5 = *(int *)(field + 0x3c);
    value_01 = io::SafeDoubleToFloat((double)int_value);
    if (iVar5 == 3) {
      Reflection::AddFloat(reflection,message,field,value_01);
    }
    else {
      Reflection::SetFloat(reflection,message,field,value_01);
    }
    break;
  case 7:
    if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
      bVar4 = ConsumeUnsignedInteger(this,(uint64 *)&int_value,1);
      if (!bVar4) goto LAB_002fe9a9;
      if (*(int *)(field + 0x3c) == 3) {
        Reflection::AddBool(reflection,message,field,int_value != 0);
      }
      else {
        Reflection::SetBool(reflection,message,field,int_value != 0);
      }
      break;
    }
    value = 0;
    local_58[0]._M_allocated_capacity = (ulong)(uint7)local_58[0]._1_7_ << 8;
    int_value = (int64)local_58;
    bVar4 = ConsumeIdentifier(this,(string *)&int_value);
    if (bVar4) {
      iVar5 = std::__cxx11::string::compare((char *)&int_value);
      if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&int_value), iVar5 == 0))
         || (iVar5 = std::__cxx11::string::compare((char *)&int_value), iVar5 == 0)) {
        bVar4 = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&int_value);
        if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&int_value), iVar5 != 0)
            ) && (iVar5 = std::__cxx11::string::compare((char *)&int_value), iVar5 != 0)) {
          std::operator+(&local_f8,"Invalid value for boolean field \"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_f8);
          psVar10 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_b0.field_2._M_allocated_capacity = *psVar10;
            local_b0.field_2._8_8_ = plVar8[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar10;
            local_b0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_b0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::operator+(&local_d0,&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &int_value);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
          pFVar11 = (FieldDescriptor *)(plVar8 + 2);
          if ((FieldDescriptor *)*plVar8 == pFVar11) {
            value_4._M_string_length = *(size_type *)pFVar11;
            value_4.field_2._M_allocated_capacity = plVar8[3];
            local_90 = (undefined1  [8])&value_4._M_string_length;
          }
          else {
            value_4._M_string_length = *(size_type *)pFVar11;
            local_90 = (undefined1  [8])*plVar8;
          }
          value_4._M_dataplus._M_p = (pointer)plVar8[1];
          *plVar8 = (long)pFVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      (string *)local_90);
          if (local_90 != (undefined1  [8])&value_4._M_string_length) {
            operator_delete((void *)local_90);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          goto LAB_002fe98f;
        }
        bVar4 = false;
      }
      if (*(int *)(field + 0x3c) == 3) {
        bVar2 = true;
        Reflection::AddBool(reflection,message,field,bVar4);
      }
      else {
        bVar2 = true;
        Reflection::SetBool(reflection,message,field,bVar4);
      }
    }
    else {
LAB_002fe98f:
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)int_value != local_58) {
      operator_delete((void *)int_value);
    }
    if (!bVar2) goto LAB_002fe9a9;
    goto switchD_002fdef8_default;
  case 8:
    local_90 = (undefined1  [8])&value_4._M_string_length;
    value_4._M_dataplus._M_p = (pointer)0x0;
    value_4._M_string_length = value_4._M_string_length & 0xffffffffffffff00;
    value_4.field_2._8_8_ = 0x7fffffffffffffff;
    local_d8 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar4 = ConsumeIdentifier(this,(string *)local_90);
      if (!bVar4) goto LAB_002fe867;
      value_00 = EnumDescriptor::FindValueByName(local_d8,(string *)local_90);
LAB_002fe50d:
      if (value_00 == (EnumValueDescriptor *)0x0) {
        if ((value_4.field_2._8_8_ == 0x7fffffffffffffff) ||
           (bVar4 = Reflection::SupportsUnknownEnumValues(reflection), !bVar4)) {
          if (this->allow_unknown_enum_ == false) {
            std::operator+(&local_f8,"Unknown enumeration value of \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90);
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
            psVar10 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0.field_2._8_8_ = puVar7[3];
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_b0._M_string_length = puVar7[1];
            *puVar7 = psVar10;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            std::operator+(&local_d0,&local_b0,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            psVar10 = puVar7 + 2;
            if ((size_type *)*puVar7 == psVar10) {
              local_58[0]._0_8_ = *psVar10;
              local_58[0]._8_8_ = puVar7[3];
              int_value = (int64)local_58;
            }
            else {
              local_58[0]._0_8_ = *psVar10;
              int_value = (int64)*puVar7;
            }
            value = puVar7[1];
            *puVar7 = psVar10;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)&int_value);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)int_value != local_58) {
              operator_delete((void *)int_value);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            paVar9 = &local_f8.field_2;
            goto LAB_002fe85d;
          }
          std::operator+(&local_f8,"Unknown enumeration value of \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90);
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
          psVar10 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_b0.field_2._M_allocated_capacity = *psVar10;
            local_b0.field_2._8_8_ = puVar7[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar10;
            local_b0._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_b0._M_string_length = puVar7[1];
          *puVar7 = psVar10;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          std::operator+(&local_d0,&local_b0,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          field);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
          psVar10 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar10) {
            local_58[0]._0_8_ = *psVar10;
            local_58[0]._8_8_ = plVar8[3];
            int_value = (int64)local_58;
          }
          else {
            local_58[0]._0_8_ = *psVar10;
            int_value = (int64)*plVar8;
          }
          value = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        (string *)&int_value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)int_value != local_58) {
            operator_delete((void *)int_value);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          bVar4 = true;
          field = (FieldDescriptor *)0x1;
        }
        else {
          bVar4 = true;
          if (*(int *)(field + 0x3c) == 3) {
            Reflection::AddEnumValue(reflection,message,field,value_4.field_2._8_4_);
            field = (FieldDescriptor *)0x1;
          }
          else {
            Reflection::SetEnumValue(reflection,message,field,value_4.field_2._8_4_);
            field = (FieldDescriptor *)0x1;
          }
        }
      }
      else {
        if (*(int *)(field + 0x3c) == 3) {
          Reflection::AddEnum(reflection,message,field,value_00);
        }
        else {
          Reflection::SetEnum(reflection,message,field,value_00);
        }
        bVar4 = false;
      }
    }
    else {
      int_value = (int64)local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&int_value,"-","");
      __n = (this->tokenizer_).current_.text._M_string_length;
      if ((__n == value) &&
         ((__n == 0 ||
          (iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)int_value,__n),
          iVar5 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)int_value != local_58) {
          operator_delete((void *)int_value);
        }
LAB_002fe47a:
        bVar4 = ConsumeSignedInteger(this,(int64 *)(value_4.field_2._M_local_buf + 8),0x7fffffff);
        if (bVar4) {
          int_value = (int64)local_58;
          pcVar6 = FastInt64ToBufferLeft(value_4.field_2._8_8_,local_58[0]._M_local_buf);
          value = (long)pcVar6 - (long)local_58;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,int_value,value + int_value);
          std::__cxx11::string::operator=((string *)local_90,(string *)&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          value_00 = EnumDescriptor::FindValueByNumber(local_d8,value_4.field_2._8_4_);
          goto LAB_002fe50d;
        }
      }
      else {
        TVar1 = (this->tokenizer_).current_.type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)int_value != local_58) {
          operator_delete((void *)int_value);
        }
        if (TVar1 == TYPE_INTEGER) goto LAB_002fe47a;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &int_value,"Expected integer or identifier, got: ",
                       &(this->tokenizer_).current_.text);
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    (string *)&int_value);
        paVar9 = local_58;
        local_f8._M_dataplus._M_p = (pointer)int_value;
LAB_002fe85d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar9) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
      }
LAB_002fe867:
      bVar4 = true;
      field = (FieldDescriptor *)0x0;
    }
    bVar12 = (byte)field;
    if (local_90 != (undefined1  [8])&value_4._M_string_length) {
      operator_delete((void *)local_90);
    }
    if (bVar4) goto LAB_002fe9ab;
    goto switchD_002fdef8_default;
  case 9:
    value = 0;
    local_58[0]._M_allocated_capacity = (ulong)(uint7)local_58[0]._1_7_ << 8;
    int_value = (int64)local_58;
    bVar4 = ConsumeString(this,(string *)&int_value);
    if (bVar4) {
      if (*(int *)(field + 0x3c) == 3) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_138,int_value,value + int_value);
        Reflection::AddString(reflection,message,field,&local_138);
        psVar3 = &local_138;
        _Var13._M_p = local_138._M_dataplus._M_p;
      }
      else {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_118,int_value,value + int_value);
        Reflection::SetString(reflection,message,field,&local_118);
        psVar3 = &local_118;
        _Var13._M_p = local_118._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var13._M_p != &psVar3->field_2) {
        operator_delete(_Var13._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)int_value != local_58) {
      operator_delete((void *)int_value);
    }
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)&int_value,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/text_format.cc"
               ,0x32c);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&int_value,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)local_90,other);
    internal::LogMessage::~LogMessage((LogMessage *)&int_value);
  default:
    goto switchD_002fdef8_default;
  }
  if (bVar4 == false) {
LAB_002fe9a9:
    bVar12 = 0;
  }
  else {
switchD_002fdef8_default:
    bVar12 = 1;
  }
LAB_002fe9ab:
  return (bool)(bVar12 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                    \
  if (field->is_repeated()) {                        \
    reflection->Add##CPPTYPE(message, field, VALUE); \
  } else {                                           \
    reflection->Set##CPPTYPE(message, field, VALUE); \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name() +
                        "\". Value: \"" + value + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64 int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              reflection->SupportsUnknownEnumValues()) {
            SET_FIELD(EnumValue, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value +
                        "\" for "
                        "field \"" +
                        field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value +
                          "\" for "
                          "field \"" +
                          field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }